

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

StringPtr * __thiscall
kj::
Table<kj::HashMap<unsigned_long,_kj::StringPtr>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_kj::StringPtr>::Callbacks>_>
::insert(Table<kj::HashMap<unsigned_long,_kj::StringPtr>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_kj::StringPtr>::Callbacks>_>
         *this,StringPtr *row)

{
  StringPtr *pSVar1;
  Impl<0UL,_false> local_28 [16];
  
  Impl<0UL,_false>::insert
            (local_28,(Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>
                       *)this,(*(long *)(this + 8) - *(long *)this) / 0x18,row,0xffffffff);
  if (local_28[0] != (Impl<0UL,_false>)0x1) {
    pSVar1 = Vector<kj::HashMap<unsigned_long,kj::StringPtr>::Entry>::
             add<kj::HashMap<unsigned_long,kj::StringPtr>::Entry>
                       ((Vector<kj::HashMap<unsigned_long,kj::StringPtr>::Entry> *)this,row);
    return pSVar1;
  }
  _::throwDuplicateTableRow();
}

Assistant:

Row& Table<Row, Indexes...>::insert(Row&& row) {
  if (kj::none != Impl<>::insert(*this, rows.size(), row, kj::maxValue)) {
    _::throwDuplicateTableRow();
  } else {
    return rows.add(kj::mv(row));
  }
}